

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  ImGuiIO::ImGuiIO(&this->IO);
  ImGuiStyle::ImGuiStyle(&this->Style);
  ImDrawListSharedData::ImDrawListSharedData(&this->DrawListSharedData);
  (this->ActiveIdClickOffset).x = 0.0;
  (this->ActiveIdClickOffset).y = 0.0;
  (this->NextWindowData).PosVal.x = 0.0;
  (this->NextWindowData).PosVal.y = 0.0;
  (this->NextWindowData).PosPivotVal.x = 0.0;
  (this->NextWindowData).PosPivotVal.y = 0.0;
  (this->NextWindowData).SizeVal.x = 0.0;
  (this->NextWindowData).SizeVal.y = 0.0;
  (this->NextWindowData).ContentSizeVal.x = 0.0;
  (this->NextWindowData).ContentSizeVal.y = 0.0;
  (this->Windows).Size = 0;
  (this->Windows).Capacity = 0;
  (this->Windows).Data = (ImGuiWindow **)0x0;
  (this->WindowsSortBuffer).Size = 0;
  (this->WindowsSortBuffer).Capacity = 0;
  (this->WindowsSortBuffer).Data = (ImGuiWindow **)0x0;
  (this->CurrentWindowStack).Size = 0;
  (this->CurrentWindowStack).Capacity = 0;
  (this->CurrentWindowStack).Data = (ImGuiWindow **)0x0;
  (this->WindowsById).Data.Size = 0;
  (this->WindowsById).Data.Capacity = 0;
  (this->WindowsById).Data.Data = (Pair *)0x0;
  (this->ColorModifiers).Size = 0;
  (this->ColorModifiers).Capacity = 0;
  (this->ColorModifiers).Data = (ImGuiColMod *)0x0;
  (this->StyleModifiers).Size = 0;
  (this->StyleModifiers).Capacity = 0;
  (this->StyleModifiers).Data = (ImGuiStyleMod *)0x0;
  (this->FontStack).Size = 0;
  (this->FontStack).Capacity = 0;
  (this->FontStack).Data = (ImFont **)0x0;
  (this->OpenPopupStack).Size = 0;
  (this->OpenPopupStack).Capacity = 0;
  (this->OpenPopupStack).Data = (ImGuiPopupRef *)0x0;
  (this->CurrentPopupStack).Size = 0;
  (this->CurrentPopupStack).Capacity = 0;
  (this->CurrentPopupStack).Data = (ImGuiPopupRef *)0x0;
  (this->NextWindowData).SizeConstraintRect.Min.x = 3.4028235e+38;
  (this->NextWindowData).SizeConstraintRect.Min.y = 3.4028235e+38;
  (this->NextWindowData).SizeConstraintRect.Max.x = -3.4028235e+38;
  (this->NextWindowData).SizeConstraintRect.Max.y = -3.4028235e+38;
  (this->NextWindowData).MenuBarOffsetMinVal.x = 0.0;
  (this->NextWindowData).MenuBarOffsetMinVal.y = 0.0;
  (this->NextWindowData).PosCond = 0;
  (this->NextWindowData).SizeCond = 0;
  (this->NextWindowData).ContentSizeCond = 0;
  (this->NextWindowData).CollapsedCond = 0;
  (this->NextWindowData).SizeConstraintCond = 0;
  (this->NextWindowData).FocusCond = 0;
  (this->NextWindowData).BgAlphaCond = 0;
  (this->NextWindowData).PosVal.x = 0.0;
  *(undefined8 *)&(this->NextWindowData).PosVal.y = 0;
  *(undefined8 *)&(this->NextWindowData).PosPivotVal.y = 0;
  *(undefined8 *)((long)&(this->NextWindowData).SizeVal.x + 1) = 0;
  *(undefined8 *)((long)&(this->NextWindowData).ContentSizeVal.x + 1) = 0;
  (this->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
  (this->NextWindowData).SizeCallbackUserData = (void *)0x0;
  (this->NextWindowData).BgAlphaVal = 3.4028235e+38;
  (this->NextWindowData).MenuBarOffsetMinVal.x = 0.0;
  (this->NavScoringRectScreen).Min.x = 3.4028235e+38;
  (this->NavScoringRectScreen).Min.y = 3.4028235e+38;
  (this->NavScoringRectScreen).Max.x = -3.4028235e+38;
  (this->NavScoringRectScreen).Max.y = -3.4028235e+38;
  (this->NavInitResultRectRel).Min.x = 3.4028235e+38;
  (this->NavInitResultRectRel).Min.y = 3.4028235e+38;
  (this->NavInitResultRectRel).Max.x = -3.4028235e+38;
  (this->NavInitResultRectRel).Max.y = -3.4028235e+38;
  (this->NavMoveResultLocal).RectRel.Min.x = 3.4028235e+38;
  (this->NavMoveResultLocal).RectRel.Min.y = 3.4028235e+38;
  (this->NavMoveResultLocal).RectRel.Max.x = -3.4028235e+38;
  (this->NavMoveResultLocal).RectRel.Max.y = -3.4028235e+38;
  (this->NavMoveResultLocal).ID = 0;
  (this->NavMoveResultLocal).ParentID = 0;
  (this->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (this->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (this->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (this->NavMoveResultOther).RectRel.Min.x = 3.4028235e+38;
  (this->NavMoveResultOther).RectRel.Min.y = 3.4028235e+38;
  (this->NavMoveResultOther).RectRel.Max.x = -3.4028235e+38;
  (this->NavMoveResultOther).RectRel.Max.y = -3.4028235e+38;
  (this->NavMoveResultOther).ID = 0;
  (this->NavMoveResultOther).ParentID = 0;
  (this->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (this->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (this->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (this->NavMoveResultOther).DistBox = 3.4028235e+38;
  (this->DrawData).Valid = false;
  (this->DrawData).TotalVtxCount = 0;
  (this->DrawData).CmdLists = (ImDrawList **)0x0;
  (this->DrawData).CmdListsCount = 0;
  (this->DrawData).TotalIdxCount = 0;
  (this->DrawDataBuilder).Layers[1].Size = 0;
  (this->DrawDataBuilder).Layers[1].Capacity = 0;
  (this->DrawDataBuilder).Layers[1].Data = (ImDrawList **)0x0;
  (this->DrawDataBuilder).Layers[0].Size = 0;
  (this->DrawDataBuilder).Layers[0].Capacity = 0;
  (this->DrawDataBuilder).Layers[0].Data = (ImDrawList **)0x0;
  ImDrawList::ImDrawList(&this->OverlayDrawList,(ImDrawListSharedData *)0x0);
  (this->DragDropPayload).DataType[0x10] = '\0';
  (this->DragDropPayload).DataType[0x11] = '\0';
  (this->DragDropPayload).DataType[0x12] = '\0';
  (this->DragDropPayload).DataType[0x13] = '\0';
  (this->DragDropPayload).DataType[0x14] = '\0';
  (this->DragDropPayload).DataType[0x15] = '\0';
  (this->DragDropPayload).DataType[0x16] = '\0';
  (this->DragDropPayload).DataType[0x17] = '\0';
  (this->DragDropPayload).DataType[0x18] = '\0';
  (this->DragDropPayload).DataType[0x19] = '\0';
  (this->DragDropPayload).DataType[0x1a] = '\0';
  (this->DragDropPayload).DataType[0x1b] = '\0';
  (this->DragDropPayload).DataType[0x1c] = '\0';
  (this->DragDropPayload).DataType[0x1d] = '\0';
  (this->DragDropPayload).DataType[0x1e] = '\0';
  (this->DragDropPayload).DataType[0x1f] = '\0';
  (this->DragDropPayload).DataType[0] = '\0';
  (this->DragDropPayload).DataType[1] = '\0';
  (this->DragDropPayload).DataType[2] = '\0';
  (this->DragDropPayload).DataType[3] = '\0';
  (this->DragDropPayload).DataType[4] = '\0';
  (this->DragDropPayload).DataType[5] = '\0';
  (this->DragDropPayload).DataType[6] = '\0';
  (this->DragDropPayload).DataType[7] = '\0';
  (this->DragDropPayload).DataType[8] = '\0';
  (this->DragDropPayload).DataType[9] = '\0';
  (this->DragDropPayload).DataType[10] = '\0';
  (this->DragDropPayload).DataType[0xb] = '\0';
  (this->DragDropPayload).DataType[0xc] = '\0';
  (this->DragDropPayload).DataType[0xd] = '\0';
  (this->DragDropPayload).DataType[0xe] = '\0';
  (this->DragDropPayload).DataType[0xf] = '\0';
  *(undefined2 *)((this->DragDropPayload).DataType + 0x20) = 0;
  (this->DragDropPayload).Data = (void *)0x0;
  (this->DragDropPayload).DataSize = 0;
  (this->DragDropPayload).SourceId = 0;
  (this->DragDropPayload).SourceParentId = 0;
  (this->DragDropPayload).DataFrameCount = -1;
  (this->DragDropPayload).Delivery = false;
  (this->DragDropTargetRect).Min.x = 3.4028235e+38;
  (this->DragDropTargetRect).Min.y = 3.4028235e+38;
  (this->DragDropTargetRect).Max.x = -3.4028235e+38;
  (this->DragDropTargetRect).Max.y = -3.4028235e+38;
  (this->DragDropPayloadBufHeap).Size = 0;
  (this->DragDropPayloadBufHeap).Capacity = 0;
  (this->DragDropPayloadBufHeap).Data = (uchar *)0x0;
  memset(&this->InputTextState,0,0xce8);
  ImFont::ImFont(&this->InputTextPasswordFont);
  (this->ColorPickerRef).x = 0.0;
  (this->ColorPickerRef).y = 0.0;
  (this->ColorPickerRef).z = 0.0;
  (this->ColorPickerRef).w = 0.0;
  (this->ScrollbarClickDeltaToGrabCenter).x = 0.0;
  (this->ScrollbarClickDeltaToGrabCenter).y = 0.0;
  (this->PrivateClipboard).Size = 0;
  (this->PrivateClipboard).Capacity = 0;
  (this->PrivateClipboard).Data = (char *)0x0;
  (this->PlatformImePos).x = 0.0;
  (this->PlatformImePos).y = 0.0;
  (this->PlatformImeLastPos).x = 0.0;
  (this->PlatformImeLastPos).y = 0.0;
  ImGuiTextBuffer::ImGuiTextBuffer(&this->SettingsIniData);
  (this->SettingsWindows).Size = 0;
  (this->SettingsWindows).Capacity = 0;
  (this->SettingsWindows).Data = (ImGuiWindowSettings *)0x0;
  (this->SettingsHandlers).Size = 0;
  (this->SettingsHandlers).Capacity = 0;
  (this->SettingsHandlers).Data = (ImGuiSettingsHandler *)0x0;
  ImGuiTextBuffer::ImGuiTextBuffer(&this->LogClipboard);
  this->Initialized = false;
  this->Font = (ImFont *)0x0;
  this->FontSize = 0.0;
  this->FontBaseSize = 0.0;
  this->FontAtlasOwnedByContext = shared_font_atlas == (ImFontAtlas *)0x0;
  if (shared_font_atlas == (ImFontAtlas *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    shared_font_atlas = (ImFontAtlas *)(*GImAllocatorAllocFunc)(0x78,GImAllocatorUserData);
    ImFontAtlas::ImFontAtlas(shared_font_atlas);
  }
  (this->IO).Fonts = shared_font_atlas;
  this->Time = 0.0;
  this->FrameCount = 0;
  this->FrameCountEnded = -1;
  this->FrameCountRendered = -1;
  this->WindowsActiveCount = 0;
  this->ActiveIdAllowNavDirFlags = 0;
  this->CurrentWindow = (ImGuiWindow *)0x0;
  this->HoveredWindow = (ImGuiWindow *)0x0;
  *(undefined8 *)((long)&this->HoveredWindow + 5) = 0;
  *(undefined8 *)((long)&this->HoveredRootWindow + 5) = 0;
  this->HoveredIdPreviousFrame = 0;
  this->HoveredIdTimer = 0.0;
  this->ActiveId = 0;
  this->ActiveIdPreviousFrame = 0;
  *(undefined8 *)((long)&this->ActiveIdPreviousFrame + 3) = 0;
  (this->ActiveIdClickOffset).x = -1.0;
  (this->ActiveIdClickOffset).y = -1.0;
  this->ActiveIdWindow = (ImGuiWindow *)0x0;
  this->ActiveIdSource = ImGuiInputSource_None;
  this->MovingWindow = (ImGuiWindow *)0x0;
  this->NextTreeNodeOpenVal = false;
  *(undefined8 *)&this->NextTreeNodeOpenCond = 0;
  *(undefined8 *)((long)&this->NavWindow + 4) = 0;
  this->NavActivateId = 0;
  this->NavActivateDownId = 0;
  this->NavActivatePressedId = 0;
  this->NavInputId = 0;
  this->NavJustTabbedId = 0;
  this->NavJustMovedToId = 0;
  this->NavNextActivateId = 0;
  this->NavInputSource = ImGuiInputSource_None;
  (this->NavScoringRectScreen).Min.x = 3.4028235e+38;
  (this->NavScoringRectScreen).Min.y = 3.4028235e+38;
  (this->NavScoringRectScreen).Max.x = -3.4028235e+38;
  (this->NavScoringRectScreen).Max.y = -3.4028235e+38;
  this->NavLayer = 0;
  *(undefined8 *)((long)&this->NavWindowingHighlightTimer + 1) = 0;
  *(undefined8 *)&this->NavScoringCount = 0;
  *(undefined8 *)((long)&this->NavWindowingTarget + 4) = 0;
  this->NavIdTabCounter = 0x7fffffff;
  this->NavIdIsAlive = false;
  this->NavMousePosDirty = false;
  this->NavDisableHighlight = true;
  this->NavInitResultId = 0;
  this->NavMoveFromClampedRefRect = false;
  this->NavMoveRequest = false;
  this->NavMoveRequestFlags = 0;
  this->NavMoveRequestForward = ImGuiNavForward_None;
  this->NavDisableMouseHover = false;
  this->NavAnyRequest = false;
  this->NavInitRequest = false;
  this->NavInitRequestFromMove = false;
  this->NavMoveClipDir = -1;
  this->NavMoveDir = -1;
  this->NavMoveDirLast = -1;
  this->ModalWindowDarkeningRatio = 0.0;
  (this->OverlayDrawList)._Data = &this->DrawListSharedData;
  (this->OverlayDrawList)._OwnerName = "##Overlay";
  this->MouseCursor = 0;
  this->DragDropActive = false;
  this->DragDropSourceFlags = 0;
  this->DragDropMouseButton = -1;
  this->DragDropTargetId = 0;
  this->DragDropAcceptIdCurrRectSurface = 0.0;
  this->DragDropAcceptIdCurr = 0;
  this->DragDropAcceptIdPrev = 0;
  this->DragDropAcceptFrameCount = -1;
  this->DragDropPayloadBufLocal[0] = '\0';
  this->DragDropPayloadBufLocal[1] = '\0';
  this->DragDropPayloadBufLocal[2] = '\0';
  this->DragDropPayloadBufLocal[3] = '\0';
  this->DragDropPayloadBufLocal[4] = '\0';
  this->DragDropPayloadBufLocal[5] = '\0';
  this->DragDropPayloadBufLocal[6] = '\0';
  this->DragDropPayloadBufLocal[7] = '\0';
  this->ScalarAsInputTextId = 0;
  this->ColorEditOptions = 0x2900000;
  this->DragCurrentAccumDirty = false;
  this->DragCurrentAccum = 0.0;
  this->DragSpeedDefaultRatio = 0.01;
  (this->ScrollbarClickDeltaToGrabCenter).x = 0.0;
  (this->ScrollbarClickDeltaToGrabCenter).y = 0.0;
  this->TooltipOverrideCount = 0;
  (this->PlatformImeLastPos).x = 3.4028235e+38;
  (this->PlatformImeLastPos).y = 3.4028235e+38;
  (this->PlatformImePos).x = 3.4028235e+38;
  (this->PlatformImePos).y = 3.4028235e+38;
  this->SettingsLoaded = false;
  this->SettingsDirtyTimer = 0.0;
  this->LogEnabled = false;
  this->LogFile = (FILE *)0x0;
  this->LogStartDepth = 0;
  this->LogAutoExpandMaxDepth = 2;
  memset(this->FramerateSecPerFrame,0,0x1e8);
  this->WantTextInputNextFrame = -1;
  this->WantCaptureMouseNextFrame = -1;
  this->WantCaptureKeyboardNextFrame = -1;
  memset(this->TempBuffer,0,0xc01);
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas) : OverlayDrawList(NULL)
    {
        Initialized = false;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();

        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredRootWindow = NULL;
        HoveredId = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdPreviousFrame = 0;
        HoveredIdTimer = 0.0f;
        ActiveId = 0;
        ActiveIdPreviousFrame = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsAlive = false;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdAllowNavDirFlags = 0;
        ActiveIdClickOffset = ImVec2(-1,-1);
        ActiveIdWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        MovingWindow = NULL;
        NextTreeNodeOpenVal = false;
        NextTreeNodeOpenCond = 0;

        NavWindow = NULL;
        NavId = NavActivateId = NavActivateDownId = NavActivatePressedId = NavInputId = 0;
        NavJustTabbedId = NavJustMovedToId = NavNextActivateId = 0;
        NavInputSource = ImGuiInputSource_None;
        NavScoringRectScreen = ImRect();
        NavScoringCount = 0;
        NavWindowingTarget = NULL;
        NavWindowingHighlightTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;
        NavLayer = 0;
        NavIdTabCounter = INT_MAX;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;
        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavInitResultId = 0;
        NavMoveFromClampedRefRect = false;
        NavMoveRequest = false;
        NavMoveRequestFlags = 0;
        NavMoveRequestForward = ImGuiNavForward_None;
        NavMoveDir = NavMoveDirLast = NavMoveClipDir = ImGuiDir_None;

        ModalWindowDarkeningRatio = 0.0f;
        OverlayDrawList._Data = &DrawListSharedData;
        OverlayDrawList._OwnerName = "##Overlay"; // Give it a name for debugging
        MouseCursor = ImGuiMouseCursor_Arrow;

        DragDropActive = false;
        DragDropSourceFlags = 0;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        ScalarAsInputTextId = 0;
        ColorEditOptions = ImGuiColorEditFlags__OptionsDefault;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        ScrollbarClickDeltaToGrabCenter = ImVec2(0.0f, 0.0f);
        TooltipOverrideCount = 0;
        PlatformImePos = PlatformImeLastPos = ImVec2(FLT_MAX, FLT_MAX);

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;

        LogEnabled = false;
        LogFile = NULL;
        LogStartDepth = 0;
        LogAutoExpandMaxDepth = 2;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
        memset(TempBuffer, 0, sizeof(TempBuffer));
    }